

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

void unpack_2d_output(float *col_fft,float *output,int n)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  int x;
  ulong uVar10;
  float *pfVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  
  lVar3 = (long)(n / 2);
  lVar4 = (long)n;
  pfVar6 = col_fft + lVar3 * lVar4;
  pfVar7 = col_fft + lVar3;
  pfVar8 = (float *)((lVar4 * 4 + 4) * lVar3 + (long)col_fft);
  pfVar11 = output + lVar4 * lVar4 * 2 + 1;
  pfVar5 = output + 1;
  for (lVar9 = 0; lVar9 <= lVar3; lVar9 = lVar9 + 1) {
    bVar12 = lVar9 != 0;
    bVar1 = lVar9 + lVar3 < lVar4;
    for (uVar10 = 0; n / 2 + 1 != uVar10; uVar10 = uVar10 + 1) {
      bVar13 = uVar10 != 0;
      bVar2 = (long)(lVar3 + uVar10) < lVar4;
      fVar14 = 0.0;
      fVar15 = 0.0;
      if ((bVar2 && bVar13) && (bVar1 && bVar12)) {
        fVar15 = pfVar8[uVar10];
      }
      pfVar5[uVar10 * 2 + -1] = col_fft[uVar10] - fVar15;
      if (bVar1 && bVar12) {
        fVar14 = pfVar6[uVar10];
      }
      fVar15 = 0.0;
      if (bVar2 && bVar13) {
        fVar15 = pfVar7[uVar10];
      }
      pfVar5[uVar10 * 2] = fVar14 + fVar15;
      if (bVar1 && bVar12) {
        fVar14 = 0.0;
        fVar15 = 0.0;
        if ((bVar2 && bVar13) && (bVar1 && bVar12)) {
          fVar15 = pfVar8[uVar10];
        }
        pfVar11[uVar10 * 2 + -1] = fVar15 + col_fft[uVar10];
        if (bVar2 && bVar13) {
          fVar14 = pfVar7[uVar10];
        }
        pfVar11[uVar10 * 2] = fVar14 - pfVar6[uVar10];
      }
    }
    pfVar6 = pfVar6 + lVar4;
    pfVar7 = pfVar7 + lVar4;
    pfVar8 = pfVar8 + lVar4;
    pfVar5 = pfVar5 + lVar4 * 2;
    col_fft = col_fft + lVar4;
    pfVar11 = pfVar11 + lVar4 * -2;
  }
  return;
}

Assistant:

static inline void unpack_2d_output(const float *col_fft, float *output,
                                    int n) {
  for (int y = 0; y <= n / 2; ++y) {
    const int y2 = y + n / 2;
    const int y_extra = y2 > n / 2 && y2 < n;

    for (int x = 0; x <= n / 2; ++x) {
      const int x2 = x + n / 2;
      const int x_extra = x2 > n / 2 && x2 < n;
      output[2 * (y * n + x)] =
          col_fft[y * n + x] - (x_extra && y_extra ? col_fft[y2 * n + x2] : 0);
      output[2 * (y * n + x) + 1] = (y_extra ? col_fft[y2 * n + x] : 0) +
                                    (x_extra ? col_fft[y * n + x2] : 0);
      if (y_extra) {
        output[2 * ((n - y) * n + x)] =
            col_fft[y * n + x] +
            (x_extra && y_extra ? col_fft[y2 * n + x2] : 0);
        output[2 * ((n - y) * n + x) + 1] =
            -(y_extra ? col_fft[y2 * n + x] : 0) +
            (x_extra ? col_fft[y * n + x2] : 0);
      }
    }
  }
}